

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_eff_lore_color_immune(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *__s;
  size_t sVar4;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s = parser_getsym(p,"color");
    sVar4 = strlen(__s);
    if (sVar4 < 2) {
      iVar1 = color_char_to_attr(*__s);
    }
    else {
      iVar1 = color_text_to_attr(__s);
    }
    if (iVar1 < 0) {
      pVar2 = PARSE_ERROR_INVALID_COLOR;
    }
    else {
      *(char *)((long)pvVar3 + 0x1a) = (char)iVar1;
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_eff_lore_color_immune(struct parser *p) {
	struct blow_effect *eff = parser_priv(p);
	const char *color;
	int attr;

	if (!eff)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	color = parser_getsym(p, "color");
	if (strlen(color) > 1)
		attr = color_text_to_attr(color);
	else
		attr = color_char_to_attr(color[0]);
	if (attr < 0)
		return PARSE_ERROR_INVALID_COLOR;
	eff->lore_attr_immune = attr;
	return PARSE_ERROR_NONE;
}